

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx *cctx,ZSTD_cParameter param,int value)

{
  int iVar1;
  int value_local;
  ZSTD_cParameter param_local;
  ZSTD_CCtx *cctx_local;
  
  if (cctx->streamStage != zcss_init) {
    iVar1 = ZSTD_isUpdateAuthorized(param);
    if (iVar1 == 0) {
      return 0xffffffffffffffc4;
    }
    cctx->cParamsChanged = 1;
  }
  if (param == ZSTD_c_experimentalParam2) {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_CCtxParam_setParameter(&cctx->requestedParams,ZSTD_c_experimentalParam2,value)
    ;
  }
  else if (param == ZSTD_c_compressionLevel) {
    if (cctx->cdict == (ZSTD_CDict *)0x0) {
      cctx_local = (ZSTD_CCtx *)
                   ZSTD_CCtxParam_setParameter(&cctx->requestedParams,ZSTD_c_compressionLevel,value)
      ;
    }
    else {
      cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
    }
  }
  else if (param - ZSTD_c_windowLog < 7) {
    if (cctx->cdict == (ZSTD_CDict *)0x0) {
      cctx_local = (ZSTD_CCtx *)ZSTD_CCtxParam_setParameter(&cctx->requestedParams,param,value);
    }
    else {
      cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
    }
  }
  else if (param - ZSTD_c_enableLongDistanceMatching < 5) {
    if (cctx->cdict == (ZSTD_CDict *)0x0) {
      cctx_local = (ZSTD_CCtx *)ZSTD_CCtxParam_setParameter(&cctx->requestedParams,param,value);
    }
    else {
      cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
    }
  }
  else if (param - ZSTD_c_contentSizeFlag < 3) {
    cctx_local = (ZSTD_CCtx *)ZSTD_CCtxParam_setParameter(&cctx->requestedParams,param,value);
  }
  else if (param == ZSTD_c_nbWorkers) {
    if ((value == 0) || (cctx->staticSize == 0)) {
      cctx_local = (ZSTD_CCtx *)
                   ZSTD_CCtxParam_setParameter(&cctx->requestedParams,ZSTD_c_nbWorkers,value);
    }
    else {
      cctx_local = (ZSTD_CCtx *)0xffffffffffffffd8;
    }
  }
  else if ((param - ZSTD_c_jobSize < 2) || (param == ZSTD_c_experimentalParam1)) {
    cctx_local = (ZSTD_CCtx *)ZSTD_CCtxParam_setParameter(&cctx->requestedParams,param,value);
  }
  else if (param == ZSTD_c_experimentalParam3) {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_CCtxParam_setParameter(&cctx->requestedParams,ZSTD_c_experimentalParam3,value)
    ;
  }
  else if (param == ZSTD_c_experimentalParam4) {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_CCtxParam_setParameter(&cctx->requestedParams,ZSTD_c_experimentalParam4,value)
    ;
  }
  else {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffd8;
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx* cctx, ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParameter (%i, %i)", (int)param, value);
    if (cctx->streamStage != zcss_init) {
        if (ZSTD_isUpdateAuthorized(param)) {
            cctx->cParamsChanged = 1;
        } else {
            return ERROR(stage_wrong);
    }   }

    switch(param)
    {
    case ZSTD_c_format :
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_compressionLevel:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_windowLog:
    case ZSTD_c_hashLog:
    case ZSTD_c_chainLog:
    case ZSTD_c_searchLog:
    case ZSTD_c_minMatch:
    case ZSTD_c_targetLength:
    case ZSTD_c_strategy:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_contentSizeFlag:
    case ZSTD_c_checksumFlag:
    case ZSTD_c_dictIDFlag:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_forceMaxWindow :  /* Force back-references to remain < windowSize,
                                   * even when referencing into Dictionary content.
                                   * default : 0 when using a CDict, 1 when using a Prefix */
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_forceAttachDict:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_nbWorkers:
        if ((value!=0) && cctx->staticSize) {
            return ERROR(parameter_unsupported);  /* MT not compatible with static alloc */
        }
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_jobSize:
    case ZSTD_c_overlapLog:
    case ZSTD_c_rsyncable:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_enableLongDistanceMatching:
    case ZSTD_c_ldmHashLog:
    case ZSTD_c_ldmMinMatch:
    case ZSTD_c_ldmBucketSizeLog:
    case ZSTD_c_ldmHashRateLog:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    default: return ERROR(parameter_unsupported);
    }
}